

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFace::~IfcFace(IfcFace *this)

{
  void *pvVar1;
  
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFace_008403f8;
  *(undefined ***)&this->field_0x48 = &PTR__IfcFace_00840470;
  *(undefined ***)
   &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcFace_00840420;
  *(undefined ***)
   &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcFace_00840448;
  pvVar1 = *(void **)&(this->super_IfcTopologicalRepresentationItem).field_0x30;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&this->field_0x40 - (long)pvVar1);
  }
  operator_delete(this,0x60);
  return;
}

Assistant:

IfcFace() : Object("IfcFace") {}